

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

STRING_HANDLE STRING_new_JSON(char *source)

{
  char *pcVar1;
  byte bVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  STRING_HANDLE __ptr;
  LOGGER_LOG p_Var7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  
  if (source == (char *)0x0) {
    p_Var7 = xlogging_get_log_function();
    if (p_Var7 != (LOGGER_LOG)0x0) {
      pcVar10 = "invalid arg (NULL)";
      iVar8 = 0x108;
LAB_00133617:
      (*p_Var7)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                ,"STRING_new_JSON",iVar8,1,pcVar10);
      return (STRING_HANDLE)0x0;
    }
  }
  else {
    sVar4 = strlen(source);
    uVar11 = 0;
    uVar5 = 0;
    for (sVar9 = 0; sVar4 != sVar9; sVar9 = sVar9 + 1) {
      bVar2 = source[sVar9];
      if ((char)bVar2 < '\0') {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 == (LOGGER_LOG)0x0) {
          return (STRING_HANDLE)0x0;
        }
        pcVar10 = "invalid character in input string";
        iVar8 = 300;
        goto LAB_00133617;
      }
      if (bVar2 < 0x20) {
        uVar5 = uVar5 + 1;
      }
      else if ((bVar2 - 0x22 < 0x3b) &&
              ((0x400000000002001U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)) {
        uVar11 = uVar11 + 1;
      }
    }
    uVar3 = 0xffffffffffffffff;
    uVar6 = uVar5 * 5;
    if (0x3333333333333333 < uVar5) {
      uVar6 = uVar3;
    }
    uVar5 = uVar6 + sVar4;
    if (CARRY8(uVar6,sVar4)) {
      uVar5 = uVar3;
    }
    uVar6 = uVar11 + uVar5;
    if (CARRY8(uVar11,uVar5)) {
      uVar6 = uVar3;
    }
    uVar5 = uVar6 + 3;
    if (0xfffffffffffffffc < uVar6) {
      uVar5 = uVar3;
    }
    if (uVar5 == 0xffffffffffffffff) {
      p_Var7 = xlogging_get_log_function();
      if (p_Var7 != (LOGGER_LOG)0x0) {
        pcVar10 = "malloc len overflow";
        iVar8 = 0x139;
        goto LAB_00133617;
      }
    }
    else {
      __ptr = (STRING_HANDLE)malloc(8);
      if (__ptr == (STRING_HANDLE)0x0) {
        p_Var7 = xlogging_get_log_function();
        if (p_Var7 != (LOGGER_LOG)0x0) {
          pcVar10 = "malloc json failure";
          iVar8 = 0x13e;
          goto LAB_00133617;
        }
      }
      else {
        pcVar10 = (char *)malloc(uVar5);
        __ptr->s = pcVar10;
        if (pcVar10 == (char *)0x0) {
          free(__ptr);
          p_Var7 = xlogging_get_log_function();
          if (p_Var7 != (LOGGER_LOG)0x0) {
            pcVar10 = "malloc failed";
            iVar8 = 0x145;
            goto LAB_00133617;
          }
        }
        else {
          *pcVar10 = '\"';
          uVar11 = 1;
          for (sVar9 = 0; sVar4 != sVar9; sVar9 = sVar9 + 1) {
            bVar2 = source[sVar9];
            if (((char)bVar2 < ' ') && (uVar11 + 6 <= uVar5)) {
              pcVar1 = pcVar10 + uVar11;
              pcVar1[0] = '\\';
              pcVar1[1] = 'u';
              pcVar1[2] = '0';
              pcVar1[3] = '0';
              pcVar10[uVar11 + 4] = "0123456789ABCDEF"[bVar2 >> 4];
              pcVar10[uVar11 + 5] = "0123456789ABCDEF"[bVar2 & 0xf];
              uVar11 = uVar11 + 6;
            }
            else {
              uVar3 = uVar11 + 2;
              if ((bVar2 == 0x22) && (uVar3 <= uVar5)) {
                (pcVar10 + uVar11)[0] = '\\';
                (pcVar10 + uVar11)[1] = '\"';
                uVar11 = uVar3;
              }
              else if ((bVar2 == 0x5c) && (uVar3 <= uVar5)) {
                (pcVar10 + uVar11)[0] = '\\';
                (pcVar10 + uVar11)[1] = '\\';
                uVar11 = uVar3;
              }
              else if ((bVar2 == 0x2f) && (uVar3 <= uVar5)) {
                (pcVar10 + uVar11)[0] = '\\';
                (pcVar10 + uVar11)[1] = '/';
                uVar11 = uVar3;
              }
              else {
                pcVar10[uVar11] = bVar2;
                uVar11 = uVar11 + 1;
              }
            }
          }
          if (uVar11 + 1 < uVar5) {
            pcVar10 = __ptr->s + uVar11;
            pcVar10[0] = '\"';
            pcVar10[1] = '\0';
            return __ptr;
          }
          free(__ptr->s);
          free(__ptr);
        }
      }
    }
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE STRING_new_JSON(const char* source)
{
    STRING* result;
    if (source == NULL)
    {
        /*Codes_SRS_STRING_02_011: [If source is NULL then STRING_new_JSON shall return NULL.] */
        result = NULL;
        LogError("invalid arg (NULL)");
    }
    else
    {
        size_t i;
        size_t nControlCharacters = 0; /*counts how many characters are to be expanded from 1 character to \uxxxx (6 characters)*/
        size_t nEscapeCharacters = 0;
        size_t vlen = strlen(source);

        for (i = 0; i < vlen; i++)
        {
            /*Codes_SRS_STRING_02_014: [If any character has the value outside [1...127] then STRING_new_JSON shall fail and return NULL.] */
            if ((unsigned char)source[i] >= 128) /*this be a UNICODE character begin*/
            {
                break;
            }
            else
            {
                if (source[i] <= 0x1F)
                {
                    nControlCharacters++;
                }
                else if (
                    (source[i] == '"') ||
                    (source[i] == '\\') ||
                    (source[i] == '/')
                    )
                {
                    nEscapeCharacters++;
                }
            }
        }

        if (i < vlen)
        {
            result = NULL;
            LogError("invalid character in input string");
        }
        else
        {
            //size_t malloc_len = vlen + 5 * nControlCharacters + nEscapeCharacters + 3;
            size_t malloc_len = safe_multiply_size_t(5, nControlCharacters);
            malloc_len = safe_add_size_t(malloc_len, vlen);
            malloc_len = safe_add_size_t(malloc_len, nEscapeCharacters);
            malloc_len = safe_add_size_t(malloc_len, 3);

            if (malloc_len == SIZE_MAX)
            {
                result = NULL;
                LogError("malloc len overflow");
            }
            else if ((result = (STRING*)malloc(sizeof(STRING))) == NULL)
            {
                /*Codes_SRS_STRING_02_021: [If the complete JSON representation cannot be produced, then STRING_new_JSON shall fail and return NULL.] */
                LogError("malloc json failure");
            }
            else if ((result->s = (char*)malloc(malloc_len)) == NULL)
            {
                /*Codes_SRS_STRING_02_021: [If the complete JSON representation cannot be produced, then STRING_new_JSON shall fail and return NULL.] */
                free(result);
                result = NULL;
                LogError("malloc failed");
            }
            else
            {
                size_t pos = 0;
                /*Codes_SRS_STRING_02_012: [The string shall begin with the quote character.] */
                result->s[pos++] = '"';
                for (i = 0; i < vlen; i++)
                {
                    if ((source[i] <= 0x1F) && ((pos + 6) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_019: [If the character code is less than 0x20 then it shall be represented as \u00xx, where xx is the hex representation of the character code.]*/
                        result->s[pos++] = '\\';
                        result->s[pos++] = 'u';
                        result->s[pos++] = '0';
                        result->s[pos++] = '0';
                        result->s[pos++] = hexToASCII[(source[i] & 0xF0) >> 4]; /*high nibble*/
                        result->s[pos++] = hexToASCII[source[i] & 0x0F]; /*low nibble*/
                    }
                    else if ((source[i] == '"') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_016: [If the character is " (quote) then it shall be repsented as \".] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '"';
                    }
                    else if ((source[i] == '\\') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_017: [If the character is \ (backslash) then it shall represented as \\.] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '\\';
                    }
                    else if ((source[i] == '/') && ((pos + 2) <= malloc_len))
                    {
                        /*Codes_SRS_STRING_02_018: [If the character is / (slash) then it shall be represented as \/.] */
                        result->s[pos++] = '\\';
                        result->s[pos++] = '/';
                    }
                    else if (pos < malloc_len)
                    {
                        /*Codes_SRS_STRING_02_013: [The string shall copy the characters of source "as they are" (until the '\0' character) with the following exceptions:] */
                        result->s[pos++] = source[i];
                    }
                    else
                    {
                        free(result->s);
                        free(result);
                        result = NULL;
                        break;
                    }
                }

                if ((pos + 1) < malloc_len)
                {
                    /*Codes_SRS_STRING_02_020: [The string shall end with " (quote).] */
                    result->s[pos++] = '"';
                    /*zero terminating it*/
                    result->s[pos] = '\0';
                }
                else
                {
                    free(result->s);
                    free(result);
                    result = NULL;
                }
            }
        }

    }
    return (STRING_HANDLE)result;
}